

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int setbfe(match *res,bitfield *bf,expr *expr)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ull uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (expr->isimm == 0) {
LAB_0016b329:
    uVar2 = 0;
  }
  else {
    if ((expr->type != EXPR_NUM) || (bf->pcrel != 0)) {
      iVar1 = res->nrelocs;
      lVar3 = (long)iVar1;
      if (lVar3 != 8) {
        res->relocs[lVar3].bf = bf;
        res->relocs[lVar3].expr = expr;
        res->nrelocs = iVar1 + 1;
        return 1;
      }
      __assert_fail("res->nrelocs != 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/polachok[P]envytools/envydis/core.c"
                    ,299,"int setbfe(struct match *, const struct bitfield *, const struct expr *)")
      ;
    }
    uVar8 = expr->num1 - bf->addend ^ bf->xorend;
    iVar1 = bf->sbf[0].len;
    uVar6 = uVar8;
    if (bf->lut != (ull *)0x0) {
      uVar2 = 1 << ((char)bf->sbf[1].len + (char)iVar1 & 0x1fU);
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      for (; uVar7 = uVar6, uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if (bf->lut[uVar5] == uVar8) {
          uVar6 = uVar5;
          uVar7 = uVar5 & 0xffffffff;
          break;
        }
      }
      if ((uint)uVar7 == uVar2) goto LAB_0016b329;
    }
    uVar6 = uVar6 >> ((byte)bf->shr & 0x3f);
    setsbf(res,bf->sbf[0].pos,iVar1,uVar6);
    setsbf(res,bf->sbf[1].pos,bf->sbf[1].len,uVar6 >> ((byte)bf->sbf[0].len & 0x3f));
    uVar2 = bf->sbf[0].len + bf->shr + bf->sbf[1].len;
    uVar6 = ~(-1L << ((byte)uVar2 & 0x3f));
    if (0x3f < uVar2) {
      uVar6 = 0xffffffffffffffff;
    }
    iVar1 = bf->wrapok;
    uVar4 = getbf(bf,res->a,res->m,(disctx *)0x0);
    uVar2 = (uint)(((uVar4 ^ expr->num1) & (-(ulong)(iVar1 == 0) | uVar6)) == 0);
  }
  return uVar2;
}

Assistant:

int setbfe (struct match *res, const struct bitfield *bf, const struct expr *expr) {
	if (!expr->isimm)
		return 0;
	if (expr->type != EXPR_NUM || bf->pcrel) {
		assert (res->nrelocs != 8);
		res->relocs[res->nrelocs].bf = bf;
		res->relocs[res->nrelocs].expr = expr;
		res->nrelocs++;
		return 1;
	}
	ull num = (expr->num1 - bf->addend) ^ bf->xorend;
	if (bf->lut) {
		int max = 1 << (bf->sbf[0].len + bf->sbf[1].len);
		int j = 0;
		for (j = 0; j < max; j++)
			if (bf->lut[j] == num)
				break;
		if (j == max)
			return 0;
		num = j;
	}
	num >>= bf->shr;
	setsbf(res, bf->sbf[0].pos, bf->sbf[0].len, num);
	num >>= bf->sbf[0].len;
	setsbf(res, bf->sbf[1].pos, bf->sbf[1].len, num);
	ull mask = ~0ull;
	ull totalsz = bf->shr + bf->sbf[0].len + bf->sbf[1].len;
	if (bf->wrapok && totalsz < 64)
		mask = (1ull << totalsz) - 1;
	return (getbf(bf, res->a, res->m, 0) & mask) == (expr->num1 & mask);
}